

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_malloc_zero_bytes(void)

{
  int iVar1;
  void *pvVar2;
  cargo_t local_28;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init(&local_28,0,"program");
  if (iVar1 == 0) {
    cargo_set_memfunctions(_cargo_test_malloc,(cargo_realloc_f)0x0,(cargo_free_f)0x0);
    _cargo_test_set_malloc_fail_count(0);
    pvVar2 = _cargo_malloc(0);
    if (pvVar2 == (void *)0x0) {
      if (malloc_current != 0) {
        pcStack_18 = "Unexpected call to malloc";
      }
    }
    else {
      pcStack_18 = "Did not get expected error";
    }
    cargo_set_memfunctions((cargo_malloc_f)0x0,(cargo_realloc_f)0x0,(cargo_free_f)0x0);
    _cargo_test_set_malloc_fail_count(0);
    cargo_destroy(&local_28);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_malloc_zero_bytes)
{
    cargo_set_memfunctions(_cargo_test_malloc, NULL, NULL);
    _cargo_test_set_malloc_fail_count(0);

    cargo_assert(_cargo_malloc(0) == NULL, "Did not get expected error");
    cargo_assert(malloc_current == 0, "Unexpected call to malloc");

    _TEST_CLEANUP();
    cargo_set_memfunctions(NULL, NULL, NULL);
    _cargo_test_set_malloc_fail_count(0);
}